

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>
slang::ast::getDirAndType(Symbol *port)

{
  ArgumentDirection *pAVar1;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar2;
  Type *local_40;
  MultiPortSymbol *local_38;
  MultiPortSymbol *mp;
  PortSymbol *local_28;
  PortSymbol *ps;
  Symbol *port_local;
  Type *local_10;
  
  ps = (PortSymbol *)port;
  if (port->kind == Port) {
    local_28 = Symbol::as<slang::ast::PortSymbol>(port);
    pAVar1 = &local_28->direction;
    mp = (MultiPortSymbol *)PortSymbol::getType(local_28);
    std::pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>::
    pair<const_slang::ast::Type_*,_true>
              ((pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> *)&port_local,pAVar1,
               (Type **)&mp);
  }
  else {
    local_38 = Symbol::as<slang::ast::MultiPortSymbol>(port);
    pAVar1 = &local_38->direction;
    local_40 = MultiPortSymbol::getType(local_38);
    std::pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>::
    pair<const_slang::ast::Type_*,_true>
              ((pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> *)&port_local,pAVar1,
               &local_40);
  }
  pVar2._4_4_ = 0;
  pVar2.first = (uint)port_local;
  pVar2.second = local_10;
  return pVar2;
}

Assistant:

static std::pair<ArgumentDirection, const Type*> getDirAndType(const Symbol& port) {
    if (port.kind == SymbolKind::Port) {
        auto& ps = port.as<PortSymbol>();
        return {ps.direction, &ps.getType()};
    }
    else {
        auto& mp = port.as<MultiPortSymbol>();
        return {mp.direction, &mp.getType()};
    }
}